

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_aa461::CreateMemberAccess
                    (VmModule *module,SynBase *source,VmValue *ptr,VmValue *shift,
                    TypeBase *structType,InplaceStr name)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType VVar3;
  SynBase *local_48;
  TypeBase *local_40;
  VmInstruction *inst;
  TypeBase *structType_local;
  VmValue *shift_local;
  VmValue *ptr_local;
  SynBase *source_local;
  VmModule *module_local;
  
  if ((ptr->type).type != VM_TYPE_POINTER) {
    __assert_fail("ptr->type.type == VM_TYPE_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x220,
                  "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
                 );
  }
  bVar1 = VmType::operator==(&shift->type,&VmType::Int);
  if (!bVar1) {
    __assert_fail("shift->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x221,
                  "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
                 );
  }
  VVar3 = VmType::Pointer(structType);
  local_48 = VVar3._0_8_;
  local_40 = VVar3.structType;
  VVar3.structType = (TypeBase *)0x22;
  VVar3._0_8_ = local_40;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_aa461 *)module,(VmModule *)source,local_48,VVar3,
                             (VmInstructionType)ptr,shift,(VmValue *)module);
  (pVVar2->super_VmValue).comment.begin = name.begin;
  (pVVar2->super_VmValue).comment.end = name.end;
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateMemberAccess(VmModule *module, SynBase *source, VmValue *ptr, VmValue *shift, TypeBase *structType, InplaceStr name)
	{
		assert(ptr->type.type == VM_TYPE_POINTER);
		assert(shift->type == VmType::Int);

		VmInstruction *inst = CreateInstruction(module, source, VmType::Pointer(structType), VM_INST_ADD, ptr, shift);

		inst->comment = name;

		return inst;
	}